

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_perftest.cc
# Opt level: O0

int main(void)

{
  FILE *pFVar1;
  bool bVar2;
  LoadStatus LVar3;
  undefined8 uVar4;
  int64_t iVar5;
  float *pfVar6;
  uint *puVar7;
  size_type sVar8;
  reference pvVar9;
  float local_204;
  ulong local_1a0;
  size_t i_1;
  uint local_190;
  float total;
  int max;
  int min;
  int delta;
  undefined1 local_160 [8];
  BuildLog log_1;
  int64_t start;
  int i;
  int kNumRepetitions;
  undefined1 local_c0 [8];
  BuildLog log;
  undefined1 local_48 [8];
  string err;
  vector<int,_std::allocator<int>_> times;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8));
  std::__cxx11::string::string((string *)local_48);
  bVar2 = WriteTestData((string *)local_48);
  pFVar1 = _stderr;
  if (bVar2) {
    BuildLog::BuildLog((BuildLog *)local_c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kNumRepetitions,"BuildLogPerfTest-tempfile",
               (allocator<char> *)((long)&i + 3));
    LVar3 = BuildLog::Load((BuildLog *)local_c0,(string *)&kNumRepetitions,(string *)local_48);
    times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_1_ = LVar3 == LOAD_ERROR;
    std::__cxx11::string::~string((string *)&kNumRepetitions);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
    pFVar1 = _stderr;
    if (times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_1_) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"Failed to read test data: %s\n",uVar4);
    }
    times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._5_3_ = 0;
    log._97_3_ = 0;
    log.needs_recompaction_ =
         times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_1_;
    BuildLog::~BuildLog((BuildLog *)local_c0);
    if (log._96_4_ == 0) {
      for (start._4_4_ = 0; start._4_4_ < 5; start._4_4_ = start._4_4_ + 1) {
        log_1._96_8_ = GetTimeMillis();
        BuildLog::BuildLog((BuildLog *)local_160);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&delta,"BuildLogPerfTest-tempfile",(allocator<char> *)((long)&min + 3))
        ;
        LVar3 = BuildLog::Load((BuildLog *)local_160,(string *)&delta,(string *)local_48);
        std::__cxx11::string::~string((string *)&delta);
        std::allocator<char>::~allocator((allocator<char> *)((long)&min + 3));
        pFVar1 = _stderr;
        if (LVar3 == LOAD_ERROR) {
          uVar4 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"Failed to read test data: %s\n",uVar4);
          times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = 1;
        }
        else {
          iVar5 = GetTimeMillis();
          max = (int)iVar5 - log_1._96_4_;
          printf("%dms\n",(ulong)(uint)max);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),&max);
        }
        log._97_3_ = 0;
        log.needs_recompaction_ = LVar3 == LOAD_ERROR;
        BuildLog::~BuildLog((BuildLog *)local_160);
        if (log._96_4_ != 0) goto LAB_00106747;
      }
      pfVar6 = (float *)std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),0);
      total = *pfVar6;
      puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),0);
      local_190 = *puVar7;
      i_1._4_4_ = 0.0;
      for (local_1a0 = 0;
          sVar8 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8)),
          local_1a0 < sVar8; local_1a0 = local_1a0 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),local_1a0)
        ;
        i_1._4_4_ = (float)*pvVar9 + i_1._4_4_;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),local_1a0)
        ;
        if (*pvVar9 < (int)total) {
          pfVar6 = (float *)std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8)
                                       ,local_1a0);
          total = *pfVar6;
        }
        else {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),
                              local_1a0);
          if ((int)local_190 < *pvVar9) {
            puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)
                                        ((long)&err.field_2 + 8),local_1a0);
            local_190 = *puVar7;
          }
        }
      }
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8));
      local_204 = (float)sVar8;
      printf("min %dms  max %dms  avg %.1fms\n",(double)(i_1._4_4_ / local_204),(ulong)(uint)total,
             (ulong)local_190);
      unlink("BuildLogPerfTest-tempfile");
      times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      log.needs_recompaction_ = true;
      log._97_3_ = 0;
    }
  }
  else {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"Failed to write test data: %s\n",uVar4);
    times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
    log.needs_recompaction_ = true;
    log._97_3_ = 0;
  }
LAB_00106747:
  std::__cxx11::string::~string((string *)local_48);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8));
  return times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main() {
  vector<int> times;
  string err;

  if (!WriteTestData(&err)) {
    fprintf(stderr, "Failed to write test data: %s\n", err.c_str());
    return 1;
  }

  {
    // Read once to warm up disk cache.
    BuildLog log;
    if (!log.Load(kTestFilename, &err)) {
      fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
      return 1;
    }
  }
  const int kNumRepetitions = 5;
  for (int i = 0; i < kNumRepetitions; ++i) {
    int64_t start = GetTimeMillis();
    BuildLog log;
    if (!log.Load(kTestFilename, &err)) {
      fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
      return 1;
    }
    int delta = (int)(GetTimeMillis() - start);
    printf("%dms\n", delta);
    times.push_back(delta);
  }

  int min = times[0];
  int max = times[0];
  float total = 0;
  for (size_t i = 0; i < times.size(); ++i) {
    total += times[i];
    if (times[i] < min)
      min = times[i];
    else if (times[i] > max)
      max = times[i];
  }

  printf("min %dms  max %dms  avg %.1fms\n",
         min, max, total / times.size());

  unlink(kTestFilename);

  return 0;
}